

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t HUF_readCTable(HUF_CElt *CTable,uint *maxSymbolValuePtr,void *src,size_t srcSize,
                     uint *hasZeroWeights)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  size_t in_RCX;
  int *in_RSI;
  ulong *in_RDI;
  uint *in_R8;
  U32 n_4;
  U32 n_3;
  U16 min;
  U32 n_2;
  U16 valPerRank [14];
  U16 nbPerRank [14];
  U32 w;
  U32 n_1;
  U32 curr;
  U32 nextRankStart;
  U32 n;
  size_t readSize;
  HUF_CElt *ct;
  U32 nbSymbols;
  U32 tableLog;
  U32 rankVal [13];
  BYTE huffWeight [256];
  HUF_CElt *in_stack_fffffffffffffe00;
  ulong *elt;
  uint local_1f8;
  uint local_1f4;
  short local_1ee;
  uint local_1ec;
  short local_1e8 [16];
  short local_1c8 [18];
  uint local_1a4;
  uint local_1a0;
  int local_19c;
  int local_198;
  uint local_194;
  size_t local_190;
  ulong *local_188;
  uint local_180;
  uint local_17c;
  int local_178 [16];
  byte local_138 [264];
  uint *local_30;
  int *local_18;
  ulong *local_10;
  size_t local_8;
  
  local_17c = 0;
  local_180 = 0;
  local_188 = in_RDI + 1;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_190 = HUF_readStats((BYTE *)huffWeight._224_8_,huffWeight._216_8_,(U32 *)huffWeight._208_8_,
                            (U32 *)huffWeight._200_8_,(U32 *)huffWeight._192_8_,
                            (void *)huffWeight._184_8_,huffWeight._240_8_);
  uVar2 = ERR_isError(local_190);
  if (uVar2 == 0) {
    *local_30 = (uint)(local_178[0] != 0);
    if (local_17c < 0xd) {
      if (*local_18 + 1U < local_180) {
        local_8 = 0xffffffffffffffd0;
      }
      else {
        *local_10 = (ulong)local_17c;
        local_198 = 0;
        for (local_194 = 1; iVar1 = local_198, local_194 <= local_17c; local_194 = local_194 + 1) {
          local_19c = local_198;
          local_198 = (local_178[local_194] << ((char)local_194 - 1U & 0x1f)) + local_198;
          local_178[local_194] = iVar1;
        }
        for (local_1a0 = 0; local_1a0 < local_180; local_1a0 = local_1a0 + 1) {
          local_1a4 = (uint)local_138[local_1a0];
          HUF_setNbBits(in_stack_fffffffffffffe00,in_RCX);
        }
        memset(local_1c8,0,0x1c);
        memset(local_1e8,0,0x1c);
        for (local_1ec = 0; local_1ec < local_180; local_1ec = local_1ec + 1) {
          sVar3 = HUF_getNbBits(local_188[local_1ec]);
          local_1c8[sVar3] = local_1c8[sVar3] + 1;
        }
        local_1e8[local_17c + 1] = 0;
        local_1ee = 0;
        for (local_1f4 = local_17c; local_1f4 != 0; local_1f4 = local_1f4 - 1) {
          local_1e8[local_1f4] = local_1ee;
          local_1ee = (short)((int)(uint)(ushort)(local_1ee + local_1c8[local_1f4]) >> 1);
        }
        for (local_1f8 = 0; local_1f8 < local_180; local_1f8 = local_1f8 + 1) {
          elt = local_188 + local_1f8;
          sVar3 = HUF_getNbBits(local_188[local_1f8]);
          local_1e8[sVar3] = local_1e8[sVar3] + 1;
          HUF_setValue(elt,in_RCX);
        }
        *local_18 = local_180 - 1;
        local_8 = local_190;
      }
    }
    else {
      local_8 = 0xffffffffffffffd4;
    }
  }
  else {
    local_8 = local_190;
  }
  return local_8;
}

Assistant:

size_t HUF_readCTable (HUF_CElt* CTable, unsigned* maxSymbolValuePtr, const void* src, size_t srcSize, unsigned* hasZeroWeights)
{
    BYTE huffWeight[HUF_SYMBOLVALUE_MAX + 1];   /* init not required, even though some static analyzer may complain */
    U32 rankVal[HUF_TABLELOG_ABSOLUTEMAX + 1];   /* large enough for values from 0 to 16 */
    U32 tableLog = 0;
    U32 nbSymbols = 0;
    HUF_CElt* const ct = CTable + 1;

    /* get symbol weights */
    CHECK_V_F(readSize, HUF_readStats(huffWeight, HUF_SYMBOLVALUE_MAX+1, rankVal, &nbSymbols, &tableLog, src, srcSize));
    *hasZeroWeights = (rankVal[0] > 0);

    /* check result */
    if (tableLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (nbSymbols > *maxSymbolValuePtr+1) return ERROR(maxSymbolValue_tooSmall);

    CTable[0] = tableLog;

    /* Prepare base value per rank */
    {   U32 n, nextRankStart = 0;
        for (n=1; n<=tableLog; n++) {
            U32 curr = nextRankStart;
            nextRankStart += (rankVal[n] << (n-1));
            rankVal[n] = curr;
    }   }

    /* fill nbBits */
    {   U32 n; for (n=0; n<nbSymbols; n++) {
            const U32 w = huffWeight[n];
            HUF_setNbBits(ct + n, (BYTE)(tableLog + 1 - w) & -(w != 0));
    }   }

    /* fill val */
    {   U16 nbPerRank[HUF_TABLELOG_MAX+2]  = {0};  /* support w=0=>n=tableLog+1 */
        U16 valPerRank[HUF_TABLELOG_MAX+2] = {0};
        { U32 n; for (n=0; n<nbSymbols; n++) nbPerRank[HUF_getNbBits(ct[n])]++; }
        /* determine stating value per rank */
        valPerRank[tableLog+1] = 0;   /* for w==0 */
        {   U16 min = 0;
            U32 n; for (n=tableLog; n>0; n--) {  /* start at n=tablelog <-> w=1 */
                valPerRank[n] = min;     /* get starting value within each rank */
                min += nbPerRank[n];
                min >>= 1;
        }   }
        /* assign value within rank, symbol order */
        { U32 n; for (n=0; n<nbSymbols; n++) HUF_setValue(ct + n, valPerRank[HUF_getNbBits(ct[n])]++); }
    }

    *maxSymbolValuePtr = nbSymbols - 1;
    return readSize;
}